

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_histogram.cpp
# Opt level: O0

void Omega_h::render_histogram_matplotlib(Histogram *histogram,string *filepath)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  double dVar5;
  double local_288;
  int ret;
  double percent;
  double dStack_260;
  Int i_1;
  Real max_percent;
  double mid;
  long lStack_248;
  Int i;
  GO total;
  Real interval;
  Int nbins;
  ostream local_228 [8];
  ofstream script;
  string *filepath_local;
  Histogram *histogram_local;
  
  std::ofstream::ofstream(local_228,"Omega_h_histogram.py",_S_out);
  std::operator<<(local_228,"#!/usr/bin/python\n");
  std::operator<<(local_228,"import matplotlib\n");
  std::operator<<(local_228,"# Force matplotlib to not use any Xwindows backend.\n");
  std::operator<<(local_228,"matplotlib.use(\'Agg\')\n");
  std::operator<<(local_228,"import matplotlib.pyplot as plt\n");
  sVar2 = std::vector<long,_std::allocator<long>_>::size(&histogram->bins);
  iVar1 = (int)sVar2;
  dVar5 = (histogram->max - histogram->min) / (double)iVar1;
  std::operator<<(local_228,"a = [");
  lStack_248 = 0;
  for (mid._4_4_ = 0; mid._4_4_ < iVar1; mid._4_4_ = mid._4_4_ + 1) {
    std::ostream::operator<<(local_228,dVar5 * (double)mid._4_4_ + histogram->min + dVar5 * 0.5);
    if (mid._4_4_ + 1 < iVar1) {
      std::operator<<(local_228,", ");
    }
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](&histogram->bins,(long)mid._4_4_);
    lStack_248 = *pvVar3 + lStack_248;
  }
  std::operator<<(local_228,"]\n");
  std::operator<<(local_228,"b = [");
  dStack_260 = 0.0;
  for (percent._4_4_ = 0; percent._4_4_ < iVar1; percent._4_4_ = percent._4_4_ + 1) {
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                       (&histogram->bins,(long)percent._4_4_);
    dVar5 = ((double)*pvVar3 / (double)lStack_248) * 100.0;
    local_288 = dVar5;
    if (dVar5 < dStack_260) {
      local_288 = dStack_260;
    }
    dStack_260 = local_288;
    std::ostream::operator<<(local_228,dVar5);
    if (percent._4_4_ + 1 < iVar1) {
      std::operator<<(local_228,", ");
    }
  }
  std::operator<<(local_228,"]\n");
  std::operator<<(local_228,"fig = plt.figure(figsize=(3,2))\n");
  std::operator<<(local_228,"ax = fig.add_subplot(111)\n");
  std::operator<<(local_228,"ax.set_autoscale_on(False)\n");
  poVar4 = std::operator<<(local_228,"ax.hist(a, ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  std::operator<<(poVar4,", weights=b");
  poVar4 = std::operator<<(local_228,", range=(");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,histogram->min);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,histogram->max);
  std::operator<<(poVar4,")");
  std::operator<<(local_228,")\n");
  poVar4 = std::operator<<(local_228,"ax.axis([");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,histogram->min);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,histogram->max);
  std::operator<<(poVar4,", ");
  poVar4 = std::operator<<(local_228,"0, ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dStack_260);
  std::operator<<(poVar4,"])\n");
  poVar4 = std::operator<<(local_228,"fig.savefig(\'");
  poVar4 = std::operator<<(poVar4,(string *)filepath);
  std::operator<<(poVar4,"\', bbox_inches=\'tight\')\n");
  std::ofstream::close();
  iVar1 = system("python Omega_h_histogram.py");
  if (iVar1 != 0) {
    fail("assertion %s failed at %s +%d\n","ret == 0",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_histogram.cpp"
         ,0x7e);
  }
  std::ofstream::~ofstream(local_228);
  return;
}

Assistant:

void render_histogram_matplotlib(
    Histogram const& histogram, std::string const& filepath) {
  std::ofstream script("Omega_h_histogram.py");
  script << "#!/usr/bin/python\n";
  script << "import matplotlib\n";
  script << "# Force matplotlib to not use any Xwindows backend.\n";
  script << "matplotlib.use('Agg')\n";
  script << "import matplotlib.pyplot as plt\n";
  auto nbins = Int(histogram.bins.size());
  auto interval = (histogram.max - histogram.min) / Real(nbins);
  script << "a = [";
  GO total = 0;
  for (Int i = 0; i < nbins; ++i) {
    auto mid = (interval * i) + histogram.min + (interval / 2.0);
    script << mid;
    if (i + 1 < nbins) script << ", ";
    total += histogram.bins[std::size_t(i)];
  }
  script << "]\n";
  script << "b = [";
  Real max_percent = 0.0;
  for (Int i = 0; i < nbins; ++i) {
    auto percent = (Real(histogram.bins[std::size_t(i)]) / Real(total)) * 100.0;
    max_percent = max2(percent, max_percent);
    script << percent;
    if (i + 1 < nbins) script << ", ";
  }
  script << "]\n";
  script << "fig = plt.figure(figsize=(3,2))\n";
  script << "ax = fig.add_subplot(111)\n";
  script << "ax.set_autoscale_on(False)\n";
  script << "ax.hist(a, " << nbins << ", weights=b";
  script << ", range=(" << histogram.min << ", " << histogram.max << ")";
  script << ")\n";
  script << "ax.axis([" << histogram.min << ", " << histogram.max << ", ";
  script << "0, " << max_percent << "])\n";
  script << "fig.savefig('" << filepath << "', bbox_inches='tight')\n";
  script.close();
  int ret = ::system("python Omega_h_histogram.py");
  OMEGA_H_CHECK(ret == 0);
}